

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O1

void basic_suite::test_float_output(void)

{
  bool bVar1;
  float result;
  char input [4];
  reader reader;
  undefined1 local_175;
  float local_174;
  view_type local_170;
  char local_15c [4];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_15c,"1.0",4);
  local_170._M_len = strlen(local_15c);
  local_170._M_str = local_15c;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,&local_170);
  local_170._M_len = CONCAT44(local_170._M_len._4_4_,local_158.decoder.current.code);
  local_174 = 1.26117e-44;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x8f,"void basic_suite::test_float_output()",&local_170,&local_174);
  trial::protocol::json::basic_reader<char>::value<float>(&local_158,&local_174);
  local_170._M_len = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,double>
            ("result","1.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x92,"void basic_suite::test_float_output()",&local_174,&local_170);
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
  local_170._M_len = CONCAT71(local_170._M_len._1_7_,bVar1);
  local_175 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x93,"void basic_suite::test_float_output()",&local_170,&local_175);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_float_output()
{
    const char input[] = "1.0";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::real);
    float result;
    TRIAL_PROTOCOL_TEST_NO_THROW(reader.value(result));
    TRIAL_PROTOCOL_TEST_EQUAL(result, 1.0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}